

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_split.cpp
# Opt level: O2

Element __thiscall
ftxui::anon_unknown_5::ResizableSplitBottomBase::Render(ResizableSplitBottomBase *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar1;
  long in_RSI;
  Element EVar2;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  allocator_type local_131;
  Element local_130;
  Element local_120;
  undefined1 local_110 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_f0;
  shared_ptr<ftxui::Node> local_d8;
  ftxui local_c8 [16];
  ftxui local_b8 [16];
  Decorator local_a8;
  Decorator local_88;
  Decorator local_68;
  Decorator local_48;
  
  (**(code **)(**(long **)(in_RSI + 0x38) + 0x10))((Element *)(local_110 + 0x10));
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_object = yflex;
  local_48._M_invoker =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_manager;
  operator|((ftxui *)&local_d8,(Element *)(local_110 + 0x10),&local_48);
  separator();
  reflect((Box *)(in_RSI + 0x58));
  EVar2 = operator|(local_c8,&local_120,&local_68);
  (**(code **)(**(long **)(in_RSI + 0x28) + 0x10))
            (&local_130,*(long **)(in_RSI + 0x28),
             EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  size(&local_88,HEIGHT,EQUAL,**(int **)(in_RSI + 0x48));
  operator|(local_b8,&local_130,&local_88);
  __l._M_len = 3;
  __l._M_array = &local_d8;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_f0,__l,&local_131);
  vbox((Elements *)local_110);
  reflect((Box *)(in_RSI + 0x68));
  operator|((ftxui *)this,(Element *)local_110,&local_a8);
  std::_Function_base::~_Function_base(&local_a8.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_110 + 8));
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_f0);
  lVar1 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_d8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  std::_Function_base::~_Function_base(&local_88.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_130.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_120.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() final {
    return vbox({
               child_->Render() | yflex,
               separator() | reflect(separator_box_),
               main_->Render() | size(HEIGHT, EQUAL, *main_size_),
           }) |
           reflect(global_box_);
  }